

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrLib.cpp
# Opt level: O2

void __thiscall nv::Path::translatePath(Path *this)

{
  char cVar1;
  char *pcVar2;
  int i;
  int iVar3;
  long lVar4;
  
  if ((this->super_StringBuilder).m_str == (char *)0x0) {
    iVar3 = nvAbort("m_str != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvcore/StrLib.cpp"
                    ,0x1c8,"void nv::Path::translatePath()");
    if (iVar3 == 1) {
      raise(5);
    }
  }
  lVar4 = 0;
  do {
    pcVar2 = (this->super_StringBuilder).m_str;
    cVar1 = pcVar2[lVar4];
    if (cVar1 == '\\') {
      pcVar2[lVar4] = '/';
    }
    else if (cVar1 == '\0') {
      return;
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

void Path::translatePath()
{
	nvCheck( m_str != NULL );

	for(int i = 0; ; i++) {
		if( m_str[i] == '\0' ) break;
#if NV_PATH_SEPARATOR == '/'
		if( m_str[i] == '\\' ) m_str[i] = NV_PATH_SEPARATOR;
#else
		if( m_str[i] == '/' ) m_str[i] = NV_PATH_SEPARATOR;
#endif
	}
}